

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::MarkOrCopyLine_LINEBREAK(FlowBuffer *this)

{
  uint8 *puVar1;
  const_byteptr in_RDI;
  FlowBuffer *unaff_retaddr;
  const_byteptr data;
  int len;
  
  if ((*(long *)(in_RDI + 0x28) != 0) && (*(long *)(in_RDI + 0x30) != 0)) {
    for (puVar1 = *(uint8 **)(in_RDI + 0x28); len = (int)((ulong)puVar1 >> 0x20),
        puVar1 < *(uint8 **)(in_RDI + 0x30); puVar1 = puVar1 + 1) {
      if (*puVar1 == in_RDI[0x40]) {
        if (*(int *)(in_RDI + 8) == 0) {
          *(int *)(in_RDI + 0x1c) = (int)puVar1 - (int)*(undefined8 *)(in_RDI + 0x28);
        }
        else {
          AppendToBuffer(unaff_retaddr,in_RDI,len);
          *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + -1;
        }
        in_RDI[0x18] = '\x01';
        return;
      }
    }
    AppendToBuffer(unaff_retaddr,in_RDI,len);
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine_LINEBREAK()
	{
	if ( ! (orig_data_begin_ && orig_data_end_) )
		return;

	const_byteptr data;
	for ( data = orig_data_begin_; data < orig_data_end_; ++data )
		{
		if ( *data == linebreaker_ )
			goto found_end_of_line;
		}

	AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
	return;

found_end_of_line:
	if ( buffer_n_ == 0 )
		{
		frame_length_ = data - orig_data_begin_;
		}
	else
		{
		AppendToBuffer(orig_data_begin_, data + 1 - orig_data_begin_);
		// But eliminate the last 'linebreaker' character
		--buffer_n_;
		}
	message_complete_ = true;

#if DEBUG_FLOW_BUFFER
	fprintf(stderr, "%.6f Line complete: [%s]\n", network_time(),
	        string((const char*)begin(), (const char*)end()).c_str());
#endif
	}